

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# benchmarking.cpp
# Opt level: O1

void bench_get_descriptor
               (vector<void_(*)(integral_image_*,_interest_point_*,_float_*),_std::allocator<void_(*)(integral_image_*,_interest_point_*,_float_*)>_>
                *functions,integral_image *iimage,
               vector<interest_point,_std::allocator<interest_point>_> *interest_points,float *GW,
               vector<benchmark_data,_std::allocator<benchmark_data>_> *data)

{
  pointer piVar1;
  pointer pbVar2;
  undefined1 auVar3 [16];
  double *pdVar4;
  double *pdVar5;
  benchmark_data *pbVar6;
  float *pfVar7;
  ulong uVar8;
  undefined8 extraout_RDX;
  long lVar9;
  long lVar10;
  ulong uVar11;
  char *pcVar12;
  ulong uVar13;
  interest_point *unaff_R13;
  ulong uVar14;
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  double dVar17;
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 in_ZMM2 [64];
  interest_point ipoint;
  long lStack_1f0;
  double dStack_1e8;
  double *pdStack_1e0;
  double *pdStack_1d8;
  double *pdStack_1d0;
  double dStack_1c8;
  long lStack_1c0;
  benchmark_data *pbStack_1b8;
  double dStack_1b0;
  long lStack_1a8;
  ulong uStack_1a0;
  interest_point *piStack_198;
  ulong uStack_190;
  vector<interest_point,_std::allocator<interest_point>_> *pvStack_188;
  code *pcStack_180;
  uint local_174;
  vector<benchmark_data,_std::allocator<benchmark_data>_> *local_170;
  uint local_164;
  vector<void_(*)(integral_image_*,_interest_point_*,_float_*),_std::allocator<void_(*)(integral_image_*,_interest_point_*,_float_*)>_>
  *local_160;
  integral_image *local_158;
  float *local_150;
  interest_point local_144;
  
  if (*(long *)(functions + 8) != *(long *)functions) {
    uVar13 = 0;
    local_170 = data;
    local_160 = functions;
    local_158 = iimage;
    local_150 = GW;
    do {
      local_164 = (local_170->super__Vector_base<benchmark_data,_std::allocator<benchmark_data>_>).
                  _M_impl.super__Vector_impl_data._M_start[uVar13].num_interest_points;
      pfVar7 = (float *)(ulong)local_164;
      local_174 = 5;
      if ((int)local_164 < 5) {
        local_174 = local_164;
      }
      if (0 < (int)local_164) {
        uVar11 = (ulong)local_174;
        uVar14 = 0;
        do {
          piVar1 = (interest_points->
                   super__Vector_base<interest_point,_std::allocator<interest_point>_>)._M_impl.
                   super__Vector_impl_data._M_start;
          uVar8 = ((long)(interest_points->
                         super__Vector_base<interest_point,_std::allocator<interest_point>_>).
                         _M_impl.super__Vector_impl_data._M_finish - (long)piVar1 >> 2) *
                  -0xed7303b5cc0ed73;
          if (uVar8 < uVar14 || uVar8 - uVar14 == 0) {
            pcVar12 = "vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)";
            pcStack_180 = perf_get_descriptor;
            uVar8 = uVar14;
            std::__throw_out_of_range_fmt
                      ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",
                       uVar14);
            dStack_1e8 = 0.0;
            lStack_1f0 = 100;
            dVar17 = 1.0;
            pbStack_1b8 = (benchmark_data *)data;
            lStack_1a8 = uVar13 * 0x238;
            uStack_1a0 = uVar13;
            piStack_198 = unaff_R13;
            uStack_190 = uVar14;
            pvStack_188 = interest_points;
            pcStack_180 = (code *)uVar11;
            do {
              lStack_1f0 = (long)(dVar17 * (double)lStack_1f0);
              cpuid_basic_info(0);
              uVar13 = rdtsc();
              for (lVar9 = lStack_1f0; lVar9 != 0; lVar9 = lVar9 + -1) {
                (*(code *)pcVar12)(uVar8,extraout_RDX,pfVar7);
              }
              uVar11 = rdtsc();
              cpuid_basic_info(0);
              auVar15 = vcvtusi2sd_avx512f(in_ZMM2._0_16_,
                                           (((ulong)(uint)-(int)(uVar13 >> 0x20) << 0x20) -
                                           (uVar13 & 0xffffffff)) +
                                           (uVar11 & 0xffffffff) + (uVar11 & 0xffffffff00000000));
              dStack_1e8 = auVar15._0_8_;
              dVar17 = 100000000.0 / dStack_1e8;
            } while (2.0 < dVar17);
            pdStack_1e0 = (double *)0x0;
            pdStack_1d8 = (double *)0x0;
            pdStack_1d0 = (double *)0x0;
            dStack_1b0 = (double)lStack_1f0;
            dStack_1c8 = 0.0;
            lVar9 = 0;
            do {
              cpuid_basic_info(0);
              uVar13 = rdtsc();
              lStack_1c0 = lVar9;
              for (lVar10 = lStack_1f0; lVar10 != 0; lVar10 = lVar10 + -1) {
                (*(code *)pcVar12)(uVar8,extraout_RDX,pfVar7);
              }
              uVar11 = rdtsc();
              cpuid_basic_info(0);
              auVar15 = vcvtusi2sd_avx512f(in_ZMM2._0_16_,
                                           (((ulong)(uint)-(int)(uVar13 >> 0x20) << 0x20) -
                                           (uVar13 & 0xffffffff)) +
                                           (uVar11 & 0xffffffff) + (uVar11 & 0xffffffff00000000));
              dVar17 = auVar15._0_8_ / dStack_1b0;
              dStack_1e8 = dVar17;
              if (pdStack_1d8 == pdStack_1d0) {
                std::vector<double,std::allocator<double>>::_M_realloc_insert<double_const&>
                          ((vector<double,std::allocator<double>> *)&pdStack_1e0,
                           (iterator)pdStack_1d8,&dStack_1e8);
              }
              else {
                *pdStack_1d8 = dVar17;
                pdStack_1d8 = pdStack_1d8 + 1;
              }
              pbVar6 = pbStack_1b8;
              pdVar5 = pdStack_1d8;
              pdVar4 = pdStack_1e0;
              dStack_1c8 = dStack_1c8 + dVar17;
              lVar9 = lStack_1c0 + 1;
            } while (lVar9 != 10);
            dVar17 = dStack_1c8 / 10.0;
            lVar9 = pbStack_1b8->num_flops;
            dStack_1e8 = dVar17;
            if (pdStack_1e0 != pdStack_1d8) {
              std::
              __introsort_loop<__gnu_cxx::__normal_iterator<double*,std::vector<double,std::allocator<double>>>,long,__gnu_cxx::__ops::_Iter_less_iter>
                        (pdStack_1e0,pdStack_1d8,
                         (int)LZCOUNT((long)pdStack_1d8 - (long)pdStack_1e0 >> 3) * 2 ^ 0x7e);
              std::
              __final_insertion_sort<__gnu_cxx::__normal_iterator<double*,std::vector<double,std::allocator<double>>>,__gnu_cxx::__ops::_Iter_less_iter>
                        (pdVar4,pdVar5);
            }
            auVar18._0_8_ = ((double)lVar9 * 100.0) / dVar17;
            auVar18._8_8_ = 0;
            auVar21._8_8_ = 0x3fdfffffffffffff;
            auVar21._0_8_ = 0x3fdfffffffffffff;
            auVar3._8_8_ = 0x8000000000000000;
            auVar3._0_8_ = 0x8000000000000000;
            auVar15 = vpternlogq_avx512vl(auVar21,auVar18,auVar3,0xf8);
            auVar19._8_8_ = 0;
            auVar19._0_8_ = auVar18._0_8_ + auVar15._0_8_;
            auVar3 = vroundsd_avx(auVar19,auVar19,0xb);
            auVar20._8_8_ = 0;
            auVar20._0_8_ = dStack_1e8;
            auVar15 = vmovhps_avx(auVar20,*pdStack_1e0);
            auVar16 = vcvttpd2uqq_avx512vl(auVar15);
            auVar15._0_8_ = pbVar6->avg_cycles;
            auVar15._8_8_ = pbVar6->min_cycles;
            auVar15 = vpaddq_avx(auVar16,auVar15);
            pbVar6->avg_cycles = auVar15._0_8_;
            pbVar6->min_cycles = auVar15._8_8_;
            auVar16._8_8_ = 0;
            auVar16._0_8_ = pdStack_1d8[-1];
            lVar9 = vcvttsd2usi_avx512f(auVar16);
            pbVar6->max_cycles = pbVar6->max_cycles + lVar9;
            pbVar6->flops_per_cycle = auVar3._0_8_ / 100.0 + pbVar6->flops_per_cycle;
            operator_delete(pdStack_1e0,(long)pdStack_1d0 - (long)pdStack_1e0);
            return;
          }
          unaff_R13 = &local_144;
          pcStack_180 = (code *)0x1117e0;
          memcpy(unaff_R13,piVar1 + uVar14,0x114);
          data = (vector<benchmark_data,_std::allocator<benchmark_data>_> *)
                 ((local_170->super__Vector_base<benchmark_data,_std::allocator<benchmark_data>_>).
                  _M_impl.super__Vector_impl_data._M_start + uVar13);
          pcStack_180 = (code *)0x111809;
          pfVar7 = local_150;
          perf_get_descriptor(*(_func_void_integral_image_ptr_interest_point_ptr_float_ptr **)
                               (*(long *)local_160 + uVar13 * 8),local_158,unaff_R13,local_150,
                              (benchmark_data *)data);
          uVar14 = uVar14 + 1;
        } while (uVar14 != uVar11);
      }
      if (local_164 != 0) {
        data = (vector<benchmark_data,_std::allocator<benchmark_data>_> *)(ulong)local_174;
        uVar11 = (ulong)(int)local_174;
        pbVar2 = (local_170->super__Vector_base<benchmark_data,_std::allocator<benchmark_data>_>).
                 _M_impl.super__Vector_impl_data._M_start;
        pbVar2[uVar13].avg_cycles = pbVar2[uVar13].avg_cycles / uVar11;
        pbVar2[uVar13].max_cycles = pbVar2[uVar13].max_cycles / uVar11;
        pbVar2[uVar13].min_cycles = pbVar2[uVar13].min_cycles / uVar11;
        pbVar2[uVar13].flops_per_cycle = pbVar2[uVar13].flops_per_cycle / (double)(int)local_174;
      }
      uVar13 = uVar13 + 1;
    } while (uVar13 < (ulong)(*(long *)(local_160 + 8) - *(long *)local_160 >> 3));
  }
  return;
}

Assistant:

void bench_get_descriptor(
    const std::vector<void (*)(struct integral_image *, struct interest_point *, float *)> &functions,
    struct integral_image *iimage, std::vector<struct interest_point> *interest_points, float *GW,
    std::vector<struct benchmark_data> &data) {
    assert(functions.size() == data.size());

    // Iterating through all functions that should be benchmarked
    for (int j = 0; j < functions.size(); ++j) {
        // Specifies how many times the timing for get_descriptor will be called. The average will be taken.
        int counter = MIN(5, data[j].num_interest_points);
        for (int i = 0; i < counter; ++i) {
            struct interest_point ipoint = interest_points->at(i);
            perf_get_descriptor(functions[j], iimage, &ipoint, GW, data[j]);
        }

        // Take the average of the runs.
        if (counter != 0) {
            data[j].avg_cycles /= counter;
            data[j].max_cycles /= counter;
            data[j].min_cycles /= counter;
            data[j].flops_per_cycle /= counter;
        }
    }
}